

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
::has_element(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
              *this,value_type *elem,size_t hashval)

{
  bool bVar1;
  size_t sVar2;
  size_t in_RDX;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *in_RDI;
  uint32_t i;
  BitMask<unsigned_int,_16,_0> __end4;
  BitMask<unsigned_int,_16,_0> __begin4;
  BitMask<unsigned_int,_16,_0> *__range4;
  Group g;
  probe_seq<16UL> seq;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  slot_type *this_00;
  size_t in_stack_ffffffffffffff88;
  ctrl_t *pcVar3;
  h2_t hash;
  uint local_64;
  uint32_t local_60;
  BitMask<unsigned_int,_16,_0> local_5c;
  BitMask<unsigned_int,_16,_0> local_58;
  BitMask<unsigned_int,_16,_0> local_54;
  BitMask<unsigned_int,_16,_0> *local_50;
  GroupSse2Impl local_48;
  probe_seq<16UL> local_38;
  size_t local_20;
  
  local_20 = in_RDX;
  probe(in_RDI,in_stack_ffffffffffffff88);
  while( true ) {
    pcVar3 = in_RDI->ctrl_;
    sVar2 = probe_seq<16UL>::offset(&local_38);
    GroupSse2Impl::GroupSse2Impl(&local_48,pcVar3 + sVar2);
    hash = (h2_t)((ulong)pcVar3 >> 0x38);
    H2(local_20);
    local_54 = GroupSse2Impl::Match((GroupSse2Impl *)in_RDI,hash);
    local_50 = &local_54;
    local_58 = BitMask<unsigned_int,_16,_0>::begin(local_50);
    local_5c = BitMask<unsigned_int,_16,_0>::end
                         ((BitMask<unsigned_int,_16,_0> *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    while (bVar1 = priv::operator!=(&local_58,&local_5c), bVar1) {
      local_60 = BitMask<unsigned_int,_16,_0>::operator*((BitMask<unsigned_int,_16,_0> *)0x22c878);
      this_00 = in_RDI->slots_;
      probe_seq<16UL>::offset(&local_38,(ulong)local_60);
      hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs_impl::any>,void>::
      element<phmap::priv::FlatHashSetPolicy<cs_impl::any>>((slot_type *)0x22c8ad);
      bVar1 = cs_impl::any::operator==
                        (this_00,(any *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78
                                                ));
      if (bVar1) {
        return true;
      }
      BitMask<unsigned_int,_16,_0>::operator++(&local_58);
    }
    local_64 = (uint)GroupSse2Impl::MatchEmpty
                               ((GroupSse2Impl *)
                                CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    bVar1 = BitMask::operator_cast_to_bool((BitMask *)&local_64);
    if (bVar1) break;
    probe_seq<16UL>::next(&local_38);
    sVar2 = probe_seq<16UL>::getindex(&local_38);
    in_stack_ffffffffffffff7f = sVar2 < in_RDI->capacity_;
    if (!(bool)in_stack_ffffffffffffff7f) {
      __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x953,
                    "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<cs_impl::any>>::has_element(const value_type &, size_t) const [Policy = phmap::priv::FlatHashSetPolicy<cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<cs_impl::any>]"
                   );
    }
  }
  return false;
}

Assistant:

bool has_element(const value_type& elem, size_t hashval) const
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
						                       elem))
							return true;
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
					seq.next();
					assert(seq.getindex() < capacity_ && "full table!");
				}
				return false;
			}